

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O0

bool __thiscall
ObjectModelBuilder::buildClass(ObjectModelBuilder *this,object *classObject,bool declaration)

{
  bool bVar1;
  ulong uVar2;
  Class *this_00;
  mapped_type *ppCVar3;
  ostream *poVar4;
  value *pvVar5;
  string *psVar6;
  pointer ppVar7;
  array *paVar8;
  reference pvVar9;
  object *object;
  char *pcVar10;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  undefined1 local_2f8 [8];
  value replicator;
  const_iterator __end3_4;
  const_iterator __begin3_4;
  array *__range3_4;
  value *replicators;
  allocator local_2b9;
  key_type local_2b8;
  _Self local_298;
  const_iterator replicatorsIt;
  value *root;
  allocator local_279;
  key_type local_278;
  _Self local_258;
  const_iterator rootIt;
  value resource;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  array *__range3_3;
  value *resources;
  allocator local_211;
  key_type local_210;
  _Self local_1f0;
  const_iterator resourcesIt;
  value function;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  array *__range3_2;
  value *functions;
  allocator local_1a9;
  key_type local_1a8;
  _Self local_188;
  const_iterator functionsIt;
  value signal;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  array *__range3_1;
  value *signals;
  allocator local_141;
  key_type local_140;
  _Self local_120;
  const_iterator signalIt;
  value prop;
  const_iterator __end3;
  const_iterator __begin3;
  array *__range3;
  value *props;
  allocator local_d9;
  key_type local_d8;
  _Self local_b8;
  const_iterator propertyIt;
  undefined1 local_a0 [8];
  string alloc;
  string include;
  Class *clazz;
  undefined1 local_48 [8];
  string name;
  bool declaration_local;
  object *classObject_local;
  ObjectModelBuilder *this_local;
  
  name.field_2._M_local_buf[0xf] = declaration;
  findStringInObject((string *)local_48,classObject,"name");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"error: class ");
    pcVar10 = "";
    if ((name.field_2._M_local_buf[0xf] & 1U) != 0) {
      pcVar10 = "declaration";
    }
    poVar4 = std::operator<<(poVar4,pcVar10);
    poVar4 = std::operator<<(poVar4," missing \'name\'");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
    goto LAB_0012e7aa;
  }
  this_00 = (Class *)operator_new(0xe8);
  (this_00->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->root = (Object *)0x0;
  (this_00->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->functions).super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->functions).super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->functions).super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->signals).super__Vector_base<Signal,_std::allocator<Signal>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->signals).super__Vector_base<Signal,_std::allocator<Signal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->signals).super__Vector_base<Signal,_std::allocator<Signal>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->alloc).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->alloc).field_2 + 8) = 0;
  *(undefined8 *)&this_00->alloc = 0;
  (this_00->alloc)._M_string_length = 0;
  (this_00->include).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->include).field_2 + 8) = 0;
  *(undefined8 *)&this_00->include = 0;
  (this_00->include)._M_string_length = 0;
  (this_00->name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->name).field_2 + 8) = 0;
  *(undefined8 *)&this_00->name = 0;
  (this_00->name)._M_string_length = 0;
  *(undefined8 *)&this_00->declarationOnly = 0;
  Class::Class(this_00);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_48);
  ppCVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
            ::operator[](&this->m_classes,(key_type *)local_48);
  *ppCVar3 = this_00;
  if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
    if ((this->m_verbose & 1U) != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Class: name=\'");
      poVar4 = std::operator<<(poVar4,(string *)local_48);
      poVar4 = std::operator<<(poVar4,"\'");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    findStringInObject((string *)((long)&alloc.field_2 + 8),classObject,"include");
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      findStringInObject((string *)local_a0,classObject,"alloc");
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator=
                  ((string *)&this_00->include,(string *)(alloc.field_2._M_local_buf + 8));
        std::__cxx11::string::operator=((string *)&this_00->alloc,(string *)local_a0);
        this_00->declarationOnly = true;
        pVar11 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(&this->m_includes,(value_type *)((long)&alloc.field_2 + 8));
        propertyIt._M_node = (_Base_ptr)pVar11.first._M_node;
        if ((this->m_verbose & 1U) != 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Class (declaration): name=\'");
          poVar4 = std::operator<<(poVar4,(string *)local_48);
          poVar4 = std::operator<<(poVar4,"\' include=\'");
          poVar4 = std::operator<<(poVar4,(string *)(alloc.field_2._M_local_buf + 8));
          poVar4 = std::operator<<(poVar4,"\' alloc=\'");
          poVar4 = std::operator<<(poVar4,(string *)local_a0);
          poVar4 = std::operator<<(poVar4,"\'");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        bVar1 = false;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"error: class ");
        pcVar10 = "";
        if ((name.field_2._M_local_buf[0xf] & 1U) != 0) {
          pcVar10 = "declaration";
        }
        poVar4 = std::operator<<(poVar4,pcVar10);
        poVar4 = std::operator<<(poVar4," missing \'alloc\', name=");
        poVar4 = std::operator<<(poVar4,(string *)local_48);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
        bVar1 = true;
      }
      std::__cxx11::string::~string((string *)local_a0);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"error: class ");
      pcVar10 = "";
      if ((name.field_2._M_local_buf[0xf] & 1U) != 0) {
        pcVar10 = "declaration";
      }
      poVar4 = std::operator<<(poVar4,pcVar10);
      poVar4 = std::operator<<(poVar4," missing \'include\', name=");
      poVar4 = std::operator<<(poVar4,(string *)local_48);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)(alloc.field_2._M_local_buf + 8));
    if (bVar1) goto LAB_0012e7aa;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"properties",&local_d9);
  local_b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
       ::find(classObject,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  props = (value *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                   ::end(classObject);
  bVar1 = std::operator!=(&local_b8,(_Self *)&props);
  if (bVar1) {
    ppVar7 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
             ::operator->(&local_b8);
    pvVar5 = &ppVar7->second;
    bVar1 = picojson::value::is<std::vector<picojson::value,std::allocator<picojson::value>>>
                      (pvVar5);
    if (bVar1) {
      paVar8 = picojson::value::get<std::vector<picojson::value,std::allocator<picojson::value>>>
                         (pvVar5);
      __end3 = std::vector<picojson::value,_std::allocator<picojson::value>_>::begin(paVar8);
      prop.u_ = (_storage)
                std::vector<picojson::value,_std::allocator<picojson::value>_>::end(paVar8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                                         *)&prop.u_), bVar1) {
        pvVar9 = __gnu_cxx::
                 __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                 ::operator*(&__end3);
        picojson::value::value((value *)&signalIt,pvVar9);
        bVar1 = buildMaybeProperty(this,(value *)&signalIt,this_00);
        if (!bVar1) {
          this_local._7_1_ = 0;
        }
        picojson::value::~value((value *)&signalIt);
        if (!bVar1) goto LAB_0012e7aa;
        __gnu_cxx::
        __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
        ::operator++(&__end3);
      }
    }
    else {
      bVar1 = picojson::value::is<std::__cxx11::string>(pvVar5);
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"error: invalid property in class=");
        poVar4 = std::operator<<(poVar4,(string *)local_48);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
        goto LAB_0012e7aa;
      }
      psVar6 = picojson::value::get<std::__cxx11::string>(pvVar5);
      bVar1 = buildProperty(this,psVar6,this_00);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0012e7aa;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"signals",&local_141);
  local_120._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
       ::find(classObject,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  signals = (value *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                     ::end(classObject);
  bVar1 = std::operator!=(&local_120,(_Self *)&signals);
  if (bVar1) {
    ppVar7 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
             ::operator->(&local_120);
    pvVar5 = &ppVar7->second;
    bVar1 = picojson::value::is<std::vector<picojson::value,std::allocator<picojson::value>>>
                      (pvVar5);
    if (bVar1) {
      paVar8 = picojson::value::get<std::vector<picojson::value,std::allocator<picojson::value>>>
                         (pvVar5);
      __end3_1 = std::vector<picojson::value,_std::allocator<picojson::value>_>::begin(paVar8);
      signal.u_ = (_storage)
                  std::vector<picojson::value,_std::allocator<picojson::value>_>::end(paVar8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                                 *)&signal.u_), bVar1) {
        pvVar9 = __gnu_cxx::
                 __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                 ::operator*(&__end3_1);
        picojson::value::value((value *)&functionsIt,pvVar9);
        bVar1 = buildMaybeSignal(this,(value *)&functionsIt,this_00);
        if (!bVar1) {
          this_local._7_1_ = 0;
        }
        picojson::value::~value((value *)&functionsIt);
        if (!bVar1) goto LAB_0012e7aa;
        __gnu_cxx::
        __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
        ::operator++(&__end3_1);
      }
    }
    else {
      bVar1 = picojson::value::is<std::__cxx11::string>(pvVar5);
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"error: invalid signal in class=");
        poVar4 = std::operator<<(poVar4,(string *)local_48);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
        goto LAB_0012e7aa;
      }
      psVar6 = picojson::value::get<std::__cxx11::string>(pvVar5);
      bVar1 = buildSignal(this,psVar6,this_00);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0012e7aa;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"functions",&local_1a9);
  local_188._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
       ::find(classObject,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  functions = (value *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                       ::end(classObject);
  bVar1 = std::operator!=(&local_188,(_Self *)&functions);
  if (bVar1) {
    ppVar7 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
             ::operator->(&local_188);
    pvVar5 = &ppVar7->second;
    bVar1 = picojson::value::is<std::vector<picojson::value,std::allocator<picojson::value>>>
                      (pvVar5);
    if (bVar1) {
      paVar8 = picojson::value::get<std::vector<picojson::value,std::allocator<picojson::value>>>
                         (pvVar5);
      __end3_2 = std::vector<picojson::value,_std::allocator<picojson::value>_>::begin(paVar8);
      function.u_ = (_storage)
                    std::vector<picojson::value,_std::allocator<picojson::value>_>::end(paVar8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                                 *)&function.u_), bVar1) {
        pvVar9 = __gnu_cxx::
                 __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                 ::operator*(&__end3_2);
        picojson::value::value((value *)&resourcesIt,pvVar9);
        bVar1 = buildMaybeFunction(this,(value *)&resourcesIt,this_00);
        if (!bVar1) {
          this_local._7_1_ = 0;
        }
        picojson::value::~value((value *)&resourcesIt);
        if (!bVar1) goto LAB_0012e7aa;
        __gnu_cxx::
        __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
        ::operator++(&__end3_2);
      }
    }
    else {
      bVar1 = picojson::value::is<std::__cxx11::string>(pvVar5);
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"error: invalid function in class=");
        poVar4 = std::operator<<(poVar4,(string *)local_48);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
        goto LAB_0012e7aa;
      }
      psVar6 = picojson::value::get<std::__cxx11::string>(pvVar5);
      bVar1 = buildFunction(this,psVar6,this_00);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0012e7aa;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"resources",&local_211);
  local_1f0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
       ::find(classObject,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  resources = (value *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                       ::end(classObject);
  bVar1 = std::operator!=(&local_1f0,(_Self *)&resources);
  if (bVar1) {
    ppVar7 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
             ::operator->(&local_1f0);
    pvVar5 = &ppVar7->second;
    bVar1 = picojson::value::is<std::vector<picojson::value,std::allocator<picojson::value>>>
                      (pvVar5);
    if (bVar1) {
      paVar8 = picojson::value::get<std::vector<picojson::value,std::allocator<picojson::value>>>
                         (pvVar5);
      __end3_3 = std::vector<picojson::value,_std::allocator<picojson::value>_>::begin(paVar8);
      resource.u_ = (_storage)
                    std::vector<picojson::value,_std::allocator<picojson::value>_>::end(paVar8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_3,
                                (__normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                                 *)&resource.u_), bVar1) {
        pvVar9 = __gnu_cxx::
                 __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                 ::operator*(&__end3_3);
        picojson::value::value((value *)&rootIt,pvVar9);
        bVar1 = buildMaybeResource(this,(value *)&rootIt,this_00);
        if (!bVar1) {
          this_local._7_1_ = 0;
        }
        picojson::value::~value((value *)&rootIt);
        if (!bVar1) goto LAB_0012e7aa;
        __gnu_cxx::
        __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
        ::operator++(&__end3_3);
      }
    }
    else {
      bVar1 = picojson::value::is<std::__cxx11::string>(pvVar5);
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"error: invalid resource in class=");
        poVar4 = std::operator<<(poVar4,(string *)local_48);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
        goto LAB_0012e7aa;
      }
      psVar6 = picojson::value::get<std::__cxx11::string>(pvVar5);
      bVar1 = buildResource(this,psVar6,this_00);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0012e7aa;
      }
    }
  }
  if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_278,"root",&local_279);
    local_258._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         ::find(classObject,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    root = (value *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                    ::end(classObject);
    bVar1 = std::operator!=(&local_258,(_Self *)&root);
    if (bVar1) {
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
               ::operator->(&local_258);
      replicatorsIt._M_node = (_Base_ptr)&ppVar7->second;
      bVar1 = buildObject(this,(value *)replicatorsIt._M_node,(Object *)0x0,this_00);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0012e7aa;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8,"replicators",&local_2b9);
  local_298._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
       ::find(classObject,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  replicators = (value *)std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                         ::end(classObject);
  bVar1 = std::operator!=(&local_298,(_Self *)&replicators);
  if (bVar1) {
    ppVar7 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
             ::operator->(&local_298);
    pvVar5 = &ppVar7->second;
    bVar1 = picojson::value::is<std::vector<picojson::value,std::allocator<picojson::value>>>
                      (pvVar5);
    if (bVar1) {
      paVar8 = picojson::value::get<std::vector<picojson::value,std::allocator<picojson::value>>>
                         (pvVar5);
      __end3_4 = std::vector<picojson::value,_std::allocator<picojson::value>_>::begin(paVar8);
      replicator.u_ =
           (_storage)std::vector<picojson::value,_std::allocator<picojson::value>_>::end(paVar8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_4,
                                (__normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                                 *)&replicator.u_), bVar1) {
        pvVar9 = __gnu_cxx::
                 __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                 ::operator*(&__end3_4);
        picojson::value::value((value *)local_2f8,pvVar9);
        bVar1 = buildMaybeReplicator(this,(value *)local_2f8,this_00);
        if (!bVar1) {
          this_local._7_1_ = 0;
        }
        picojson::value::~value((value *)local_2f8);
        if (!bVar1) goto LAB_0012e7aa;
        __gnu_cxx::
        __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
        ::operator++(&__end3_4);
      }
    }
    else {
      bVar1 = picojson::value::
              is<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                        (pvVar5);
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"error: invalid \'replicators\' in class=");
        poVar4 = std::operator<<(poVar4,(string *)local_48);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
        goto LAB_0012e7aa;
      }
      object = picojson::value::
               get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                         (pvVar5);
      bVar1 = buildReplicator(this,object,this_00);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0012e7aa;
      }
    }
  }
  this_local._7_1_ = 1;
LAB_0012e7aa:
  std::__cxx11::string::~string((string *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ObjectModelBuilder::buildClass(const picojson::object &classObject, bool declaration)
{
    // Class *clazz = new Class();
    std::string name = findStringInObject(classObject, "name");
    if (name.empty()) {
        std::cerr << "error: class " << (declaration ? "declaration" : "") << " missing 'name'" << std::endl;
        return false;
    }

    Class *clazz = new Class();
    clazz->name = name;
    m_classes[name] = clazz;

    if (declaration) {
        std::string include = findStringInObject(classObject, "include");
        if (include.empty()) {
            std::cerr << "error: class " << (declaration ? "declaration" : "") << " missing 'include', name=" << name << std::endl;
            return false;
        }
        std::string alloc = findStringInObject(classObject, "alloc");
        if (alloc.empty()) {
            std::cerr << "error: class " << (declaration ? "declaration" : "") << " missing 'alloc', name=" << name << std::endl;
            return false;
        }
        clazz->include = include;
        clazz->alloc = alloc;
        clazz->declarationOnly = true;

        m_includes.insert(include);
        if (m_verbose)
            std::cerr << "Class (declaration): name='" << name << "' include='" << include << "' alloc='" << alloc << "'" << std::endl;
    } else {
        if (m_verbose)
            std::cerr << "Class: name='" << name << "'" << std::endl;
    }


    auto propertyIt = classObject.find("properties");
    if (propertyIt != classObject.end()) {
        const picojson::value &props = propertyIt->second;
        if (props.is<picojson::array>()) {
            for (auto prop : props.get<picojson::array>()) {
                if (!buildMaybeProperty(prop, clazz))
                    return false;
            }
        } else if (props.is<std::string>()) {
            if (!buildProperty(props.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid property in class=" << name << std::endl;
            return false;
        }
    }

    auto signalIt = classObject.find("signals");
    if (signalIt != classObject.end()) {
        const picojson::value &signals = signalIt->second;
        if (signals.is<picojson::array>()) {
            for (auto signal : signals.get<picojson::array>())
                if (!buildMaybeSignal(signal, clazz))
                    return false;
        } else if (signals.is<std::string>()) {
            if (!buildSignal(signals.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid signal in class=" << name << std::endl;
            return false;
        }
    }

    auto functionsIt = classObject.find("functions");
    if (functionsIt != classObject.end()) {
        const picojson::value &functions = functionsIt->second;
        if (functions.is<picojson::array>()) {
            for (auto function : functions.get<picojson::array>())
                if (!buildMaybeFunction(function, clazz))
                    return false;
        } else if (functions.is<std::string>()) {
            if (!buildFunction(functions.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid function in class=" << name << std::endl;
            return false;
        }
    }

    auto resourcesIt = classObject.find("resources");
    if (resourcesIt != classObject.end()) {
        const picojson::value &resources = resourcesIt->second;
        if (resources.is<picojson::array>()) {
            for (auto resource : resources.get<picojson::array>())
                if (!buildMaybeResource(resource, clazz))
                    return false;
        } else if (resources.is<std::string>()) {
            if (!buildResource(resources.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid resource in class=" << name << std::endl;
            return false;
        }
    }

    if (!declaration) {
        auto rootIt = classObject.find("root");
        if (rootIt != classObject.end()) {
            const picojson::value &root = rootIt->second;
            if (!buildObject(root, 0, clazz))
                return false;
        }

    }

    auto replicatorsIt = classObject.find("replicators");
    if (replicatorsIt != classObject.end()) {
        const picojson::value &replicators = replicatorsIt->second;
        if (replicators.is<picojson::array>()) {
            for (auto replicator : replicators.get<picojson::array>())
                if (!buildMaybeReplicator(replicator, clazz))
                    return false;
        } else if (replicators.is<picojson::object>()) {
            if (!buildReplicator(replicators.get<picojson::object>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid 'replicators' in class=" << name << std::endl;
            return false;
        }
    }

    return true;
}